

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O1

void us_poll_change(us_poll_t *p,us_loop_t *loop,int events)

{
  anon_struct_4_2_c726803f_for_state aVar1;
  epoll_event event;
  undefined1 local_c [12];
  
  aVar1 = p->state;
  if (((uint)aVar1 >> 0x1c & 4 | (uint)aVar1 >> 0x1f) != events) {
    p->state = (anon_struct_4_2_c726803f_for_state)
               ((uint)aVar1 & 0xfffffff |
               (((uint)aVar1 >> 0x1c & 3) + events * 8 | events & 4U) << 0x1c);
    local_c._0_4_ = events;
    local_c._4_8_ = p;
    epoll_ctl(loop->fd,3,((int)aVar1 << 4) >> 4,(epoll_event *)local_c);
  }
  return;
}

Assistant:

void us_poll_change(struct us_poll_t *p, struct us_loop_t *loop, int events) {
    int old_events = us_poll_events(p);
    if (old_events != events) {

        p->state.poll_type = us_internal_poll_type(p) | ((events & LIBUS_SOCKET_READABLE) ? POLL_TYPE_POLLING_IN : 0) | ((events & LIBUS_SOCKET_WRITABLE) ? POLL_TYPE_POLLING_OUT : 0);

#ifdef LIBUS_USE_EPOLL
        struct epoll_event event;
        event.events = events;
        event.data.ptr = p;
        epoll_ctl(loop->fd, EPOLL_CTL_MOD, p->state.fd, &event);
#else
        kqueue_change(loop->fd, p->state.fd, old_events, events, p);
#endif
        /* Set all removed events to null-polls in pending ready poll list */
        //us_internal_loop_update_pending_ready_polls(loop, p, p, old_events, events);
    }
}